

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

bool __thiscall ON_wString::IsValidIntegerNumber(ON_wString *this)

{
  uint uVar1;
  wchar_t __wc;
  wchar_t *pwVar2;
  byte bVar3;
  int iVar4;
  ON_Internal_Empty_wString *pOVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  
  pwVar2 = this->m_s;
  pOVar5 = &empty_wstring;
  if (pwVar2 != (wchar_t *)0x0) {
    pOVar5 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
  }
  uVar1 = (pOVar5->header).string_length;
  uVar6 = 0;
  if (uVar1 != 0) {
    uVar9 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar9 = uVar6;
    }
    bVar3 = 1;
    bVar8 = false;
    for (uVar7 = 0; uVar6 = (ulong)(uVar9 == uVar7), uVar9 != uVar7; uVar7 = uVar7 + 1) {
      __wc = pwVar2[uVar7];
      iVar4 = iswspace(__wc);
      if (iVar4 == 0) {
        iVar4 = iswdigit(__wc);
        if ((((iVar4 == 0) && (__wc != L'-')) && (__wc != L'+')) || (bVar8)) break;
        bVar3 = 0;
        bVar8 = false;
      }
      else {
        bVar8 = (bool)(bVar8 | bVar3 ^ 1);
      }
    }
  }
  return SUB81(uVar6,0);
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}